

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  Vardesc *pVVar1;
  Vardesc *pVVar2;
  int iVar3;
  byte bVar4;
  Instruction i;
  
  switch(e->k) {
  case VLOCAL:
    *(uint *)&e->u = (uint)(e->u).var.ridx;
    e->k = VNONRELOC;
    return;
  case VUPVAL:
    i = (e->u).info << 0x10 | 9;
    break;
  case VCONST:
    pVVar2 = (fs->ls->dyd->actvar).arr;
    pVVar1 = pVVar2 + (e->u).info;
    bVar4 = *(byte *)((long)pVVar2 + (long)(e->u).info * 0x18 + 8) & 0x3f;
    switch(bVar4) {
    case 0:
      e->k = VNIL;
      return;
    case 1:
      e->k = VFALSE;
      return;
    case 2:
      return;
    case 3:
      e->k = VKINT;
      break;
    default:
      if (bVar4 == 0x11) {
        e->k = VTRUE;
        return;
      }
      if (bVar4 == 0x13) {
        e->k = VKFLT;
        e->u = (anon_union_8_6_45a55102_for_u)(pVVar1->vd).value_;
        return;
      }
      if (bVar4 != 0x14) {
        return;
      }
    case 4:
      e->k = VKSTR;
    }
    e->u = (anon_union_8_6_45a55102_for_u)(pVVar1->vd).value_;
    return;
  case VINDEXED:
    freeregs(fs,(uint)(e->u).ind.t,(int)(e->u).ind.idx);
    i = (uint)(e->u).ind.t * 0x10000 + (e->u).info * 0x1000000 + 0xc;
    break;
  case VINDEXUP:
    i = (uint)(e->u).ind.t * 0x10000 + (e->u).info * 0x1000000 + 0xb;
    break;
  case VINDEXI:
    freereg(fs,(uint)(e->u).ind.t);
    i = (uint)(e->u).ind.t * 0x10000 + (e->u).info * 0x1000000 + 0xd;
    break;
  case VINDEXSTR:
    freereg(fs,(uint)(e->u).ind.t);
    i = (uint)(e->u).ind.t * 0x10000 + (e->u).info * 0x1000000 + 0xe;
    break;
  default:
    goto switchD_00121705_caseD_10;
  case VCALL:
  case VVARARG:
    luaK_setoneret(fs,e);
    return;
  }
  iVar3 = luaK_code(fs,i);
  (e->u).info = iVar3;
  e->k = VRELOC;
switchD_00121705_caseD_10:
  return;
}

Assistant:

void luaK_dischargevars (FuncState *fs, expdesc *e) {
  switch (e->k) {
    case VCONST: {
      const2exp(const2val(fs, e), e);
      break;
    }
    case VLOCAL: {  /* already in a register */
      int temp = e->u.var.ridx;
      e->u.info = temp;  /* (can't do a direct assignment; values overlap) */
      e->k = VNONRELOC;  /* becomes a non-relocatable value */
      break;
    }
    case VUPVAL: {  /* move value to some (pending) register */
      e->u.info = luaK_codeABC(fs, OP_GETUPVAL, 0, e->u.info, 0);
      e->k = VRELOC;
      break;
    }
    case VINDEXUP: {
      e->u.info = luaK_codeABC(fs, OP_GETTABUP, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VINDEXI: {
      freereg(fs, e->u.ind.t);
      e->u.info = luaK_codeABC(fs, OP_GETI, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VINDEXSTR: {
      freereg(fs, e->u.ind.t);
      e->u.info = luaK_codeABC(fs, OP_GETFIELD, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VINDEXED: {
      freeregs(fs, e->u.ind.t, e->u.ind.idx);
      e->u.info = luaK_codeABC(fs, OP_GETTABLE, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VVARARG: case VCALL: {
      luaK_setoneret(fs, e);
      break;
    }
    default: break;  /* there is one value available (somewhere) */
  }
}